

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSLModels.cpp
# Opt level: O3

void __thiscall XPMP2::CSLObj::Unload(CSLObj *this)

{
  pointer pcVar1;
  string local_38;
  
  if (this->xpObj != (XPLMObjectRef)0x0) {
    XPLMUnloadObject();
    this->xpObj = (XPLMObjectRef)0x0;
    this->xpObjState = OLS_UNAVAIL;
    if (glob < 1) {
      pcVar1 = (this->cslKey)._M_dataplus._M_p;
      StripXPSysDir(&local_38,&this->path);
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/CSLModels.cpp"
             ,0xf9,"Unload",logDEBUG,"Object %s / %s unloaded",pcVar1,local_38._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void CSLObj::Unload ()
{
    if (xpObj) {
        XPLMUnloadObject(xpObj);
        xpObj = NULL;
        xpObjState = OLS_UNAVAIL;
        LOG_MSG(logDEBUG, DEBUG_OBJ_UNLOADED, cslKey.c_str(), StripXPSysDir(path).c_str());
    }
}